

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choice.c
# Opt level: O0

void choice_print(t_choice *x)

{
  t_elem_conflict *ptVar1;
  t_float *w;
  t_elem_conflict *e;
  int j;
  t_choice *x_local;
  
  for (e._4_4_ = 0; (int)e._4_4_ < x->x_n; e._4_4_ = e._4_4_ + 1) {
    ptVar1 = x->x_vec + (int)e._4_4_;
    post("%2d age %2d w %5.2f %5.2f %5.2f %5.2f %5.2f %5.2f %5.2f %5.2f %5.2f %5.2f",
         (double)ptVar1->e_weight[0],(double)ptVar1->e_weight[1],(double)ptVar1->e_weight[2],
         (double)ptVar1->e_weight[3],(double)ptVar1->e_weight[4],(double)ptVar1->e_weight[5],
         (double)ptVar1->e_weight[6],(double)ptVar1->e_weight[7],(ulong)e._4_4_,
         (ulong)(uint)(int)ptVar1->e_age);
  }
  return;
}

Assistant:

static void choice_print(t_choice *x)
{
    int j;
    for (j = 0; j < x->x_n; j++)
    {
        t_elem *e = x->x_vec + j;
        t_float *w = e->e_weight;
        post("%2d age %2d \
w %5.2f %5.2f %5.2f %5.2f %5.2f %5.2f %5.2f %5.2f %5.2f %5.2f",
            j, (int)(e->e_age), w[0], w[1], w[2], w[3], w[4], w[5],
                w[6], w[7], w[8], w[9]);
    }
}